

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O0

my_rational my_rational_sum(my_rational *a,my_rational *b)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  wchar_t wVar4;
  size_t sVar5;
  size_t sVar6;
  my_rational mVar7;
  uint16_t local_98 [2];
  uint16_t local_82;
  uint t;
  _Bool over;
  uint16_t w_u16n [5];
  uint16_t rr_u16n [7];
  uint16_t sr_u16n [7];
  uint16_t r_u16n [5];
  uint16_t q_u16n [2];
  uint16_t d_u16n [4];
  uint16_t n_u16n [5];
  uint16_t b_u16n [2];
  uint16_t a_u16n [2];
  uint resd;
  uint resn;
  uint bdr;
  uint adr;
  uint g;
  my_rational *b_local;
  my_rational *a_local;
  
  uVar2 = gcd(a->d,b->d);
  uVar3 = a->d / uVar2;
  uVar2 = b->d / uVar2;
  if (((((uint)(0xffffffff / (ulong)b->d) < uVar3) || ((uint)(0xffffffff / (ulong)uVar2) < a->n)) ||
      ((uint)(0xffffffff / (ulong)uVar3) < b->n)) || (-(b->n * uVar3) - 1 < a->n * uVar2)) {
    _Var1 = ini_u16n(n_u16n + 3,2,a->n);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x79c,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = ini_u16n(n_u16n + 1,2,uVar2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7a0,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = mul_u16n(rr_u16n + 3,n_u16n + 3,n_u16n + 1,4,2,2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7a5,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = ini_u16n(n_u16n + 3,2,uVar3);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7a9,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = ini_u16n(n_u16n + 1,2,b->n);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7ad,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = mul_u16n(d_u16n + 1,n_u16n + 3,n_u16n + 1,4,2,2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7b2,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    d_u16n[0] = addip_u16n(d_u16n + 1,rr_u16n + 3,4,4);
    _Var1 = ini_u16n(n_u16n + 1,2,b->d);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7b8,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    _Var1 = mul_u16n(r_u16n + 3,n_u16n + 3,n_u16n + 1,4,2,2);
    if (_Var1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                    ,0x7bd,
                    "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                   );
    }
    wVar4 = div_u16n(r_u16n + 1,sr_u16n + 3,&local_82,d_u16n,r_u16n + 3,2,5,4);
    if ((wVar4 == L'\0') && (sVar5 = msb_u16n(r_u16n + 1,2), sVar5 < 0x21)) {
      uVar3 = ext_u16n(r_u16n + 1,2);
      if (uVar3 == 0xffffffff) {
        local_98[0] = 1;
        local_98[1] = 0;
      }
      else {
        local_98 = SUB84(0xffffffff / (ulong)(uVar3 + 1),0);
      }
      b_u16n[0] = local_98[0];
      b_u16n[1] = local_98[1];
      _Var1 = ini_u16n(n_u16n + 3,2,(uint)local_98);
      if (_Var1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x7ce,
                      "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                     );
      }
      _Var1 = mul_u16n(rr_u16n + 3,sr_u16n + 3,n_u16n + 3,7,5,2);
      if (_Var1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x7d4,
                      "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                     );
      }
      wVar4 = div_u16n(r_u16n + 1,w_u16n + 1,&local_82,rr_u16n + 3,r_u16n + 3,2,7,4);
      if (wVar4 != L'\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x7da,
                      "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                     );
      }
      sVar5 = msb_u16n(r_u16n + 1,2);
      if (0x20 < sVar5) {
        __assert_fail("msb_u16n(q_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                      "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                      ,0x7dd,
                      "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                     );
      }
      uVar2 = ext_u16n(r_u16n + 1,2);
      if (-uVar2 - 1 < (int)local_98 * uVar3) {
        if (local_98 != (uint16_t  [2])0x1) {
          __assert_fail("resd == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                        ,0x7e9,
                        "struct my_rational my_rational_sum(const struct my_rational *, const struct my_rational *)"
                       );
        }
        a_u16n[0] = 0xffff;
        a_u16n[1] = 0xffff;
      }
      else {
        a_u16n = (uint16_t  [2])(uVar2 + (int)local_98 * uVar3);
        sVar5 = msb_u16n(w_u16n + 1,7);
        sVar6 = msb_u16n(r_u16n + 3,4);
        if ((sVar6 <= sVar5 + 1) && (a_u16n != (uint16_t  [2])0xffffffff)) {
          a_u16n = (uint16_t  [2])((int)a_u16n + 1);
        }
      }
    }
    else {
      a_u16n[0] = 0xffff;
      a_u16n[1] = 0xffff;
      b_u16n[0] = 1;
      b_u16n[1] = 0;
    }
  }
  else {
    a_u16n = (uint16_t  [2])(a->n * uVar2 + b->n * uVar3);
    b_u16n = (uint16_t  [2])(uVar3 * b->d);
  }
  mVar7 = my_rational_construct((uint)a_u16n,(uint)b_u16n);
  return mVar7;
}

Assistant:

struct my_rational my_rational_sum(const struct my_rational *a,
		const struct my_rational *b)
{
	unsigned int g = gcd(a->d, b->d);
	unsigned int adr = a->d / g, bdr = b->d / g;
	unsigned int resn, resd;

	if (adr <= UINT_MAX / b->d
			&& a->n <= UINT_MAX / bdr
			&& b->n <= UINT_MAX / adr
			&& a->n * bdr <= UINT_MAX - b->n * adr) {
		resn = a->n * bdr + b->n * adr;
		resd = adr * b->d;
	} else {
		/* Overflows in native arithmetic so approximate. */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t a_u16n[MP_DIGITS], b_u16n[MP_DIGITS];
		uint16_t n_u16n[2 * MP_DIGITS + 1], d_u16n[2 * MP_DIGITS];
		uint16_t q_u16n[MP_DIGITS], r_u16n[2 * MP_DIGITS + 1];
		uint16_t sr_u16n[3 * MP_DIGITS + 1], rr_u16n[3 * MP_DIGITS + 1];
		uint16_t w_u16n[2 * MP_DIGITS + 1];
		bool over;

		over = ini_u16n(a_u16n, MP_DIGITS, a->n);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, bdr);
		if (over) {
			assert(0);
		}
		over = mul_u16n(sr_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = ini_u16n(a_u16n, MP_DIGITS, adr);
		if (over) {
			assert(0);
		}
		over = ini_u16n(b_u16n, MP_DIGITS, b->n);
		if (over) {
			assert(0);
		}
		over = mul_u16n(n_u16n + 1, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		n_u16n[0] = addip_u16n(n_u16n + 1, sr_u16n, 2 * MP_DIGITS,
			2 * MP_DIGITS);
		over = ini_u16n(b_u16n, MP_DIGITS, b->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(d_u16n, a_u16n, b_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(q_u16n, r_u16n, w_u16n, n_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS + 1, 2 * MP_DIGITS) != 0);
		if (!over && msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT) {
			unsigned int t;

			resn = ext_u16n(q_u16n, MP_DIGITS);
			/*
			 * Use as large as a numerator as possible so the
			 * approximation is as accurate as possible.
			 */
			resd = (resn < UINT_MAX) ? UINT_MAX / (resn + 1) : 1;
			resn *= resd;
			over = ini_u16n(a_u16n, MP_DIGITS, resd);
			if (over) {
				assert(0);
			}
			over = mul_u16n(sr_u16n, r_u16n, a_u16n,
				3 * MP_DIGITS + 1, 2 * MP_DIGITS + 1,
				MP_DIGITS);
			if (over) {
				assert(0);
			}
			over = (div_u16n(q_u16n, rr_u16n, w_u16n, sr_u16n,
				d_u16n, MP_DIGITS, 3 * MP_DIGITS + 1,
				2 * MP_DIGITS) != 0);
			if (over) {
				assert(0);
			}
			assert(msb_u16n(q_u16n, MP_DIGITS)
				<= sizeof(unsigned int) * CHAR_BIT);
			t = ext_u16n(q_u16n, MP_DIGITS);
			if (resn <= UINT_MAX - t) {
				resn += t;
				/* Approximate rounding to the nearest. */
				if (msb_u16n(rr_u16n, 3 * MP_DIGITS + 1) + 1
						>= msb_u16n(d_u16n,
						2 * MP_DIGITS)
						&& resn < UINT_MAX) {
					++resn;
				}
			} else {
				assert(resd == 1);
				resn = UINT_MAX;
			}
		} else {
			resn = UINT_MAX;
			resd = 1;
		}
#undef MP_DIGITS
	}
	return my_rational_construct(resn, resd);
}